

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

unsigned_short * __thiscall
Js::InterpreterStackFrame::WasmAtomicsArrayBoundsCheck<unsigned_short>
          (InterpreterStackFrame *this,byte *buffer,uint64 index,uint32 byteLength)

{
  int32 hCode;
  ScriptContext *scriptContext;
  
  if (((ulong)(buffer + index) & 1) == 0) {
    if (index + 2 <= (ulong)byteLength) {
      return (unsigned_short *)(buffer + index);
    }
    scriptContext = *(ScriptContext **)(this + 0x78);
    hCode = -0x7ff5e497;
  }
  else {
    scriptContext = *(ScriptContext **)(this + 0x78);
    hCode = -0x7ff5e489;
  }
  JavascriptError::ThrowWebAssemblyRuntimeError(scriptContext,hCode,(PCWSTR)0x0);
}

Assistant:

MemType* InterpreterStackFrame::WasmAtomicsArrayBoundsCheck(byte* buffer, uint64 index, uint32 byteLength)
    {
        MemType* readBuffer = (MemType*)(buffer + index);
        // Do alignment check to be coherent with the order the jit does the checks
        if (!::Math::IsAligned<intptr_t>((intptr_t)readBuffer, sizeof(MemType)))
        {
            JavascriptError::ThrowWebAssemblyRuntimeError(scriptContext, WASMERR_UnalignedAtomicAccess);
        }
        WasmArrayBoundsCheck<MemType>(index, byteLength);
        return readBuffer;
    }